

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessStart
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  Status SVar2;
  bool bVar3;
  size_type sVar4;
  reference aStr;
  element_type *peVar5;
  element_type *peVar6;
  Value *pVVar7;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  Value local_c30;
  anon_class_1_0_00000001 local_be2;
  v10 local_be1;
  v10 *local_be0;
  size_t local_bd8;
  string local_bd0;
  Error local_bb0;
  Value local_b88;
  ErrorCode local_b3c;
  Error local_b38;
  Value local_b10;
  ErrorCode local_ac4;
  Error local_ac0;
  anon_class_1_0_00000001 local_a92;
  v10 local_a91;
  v10 *local_a90;
  size_t local_a88;
  string local_a80;
  Error local_a60;
  Value local_a38;
  undefined1 local_9f0 [8];
  NetworkSelectionComparator guard_1;
  string local_9d0;
  ErrorCode local_9ac;
  Error local_9a8;
  Value local_980;
  ErrorCode local_934;
  Error local_930;
  anon_class_1_0_00000001 local_902;
  v10 local_901;
  v10 *local_900;
  char *local_8f8;
  string local_8f0;
  Error local_8d0;
  Value local_8a8;
  anon_class_1_0_00000001 local_85a;
  v10 local_859;
  v10 *local_858;
  char *local_850;
  string local_848;
  Error local_828;
  Value local_800;
  undefined4 local_7b8;
  ErrorCode local_7b4;
  Error local_7b0;
  Value local_788;
  undefined1 local_740 [8];
  NetworkSelectionComparator guard;
  undefined1 local_720 [4];
  BorderRouterId rawid;
  ErrorCode local_6fc;
  Error local_6f8;
  Value local_6d0;
  ErrorCode local_684;
  Error local_680;
  Value local_658;
  anon_class_1_0_00000001 local_60a;
  v10 local_609;
  v10 *local_608;
  size_t local_600;
  string local_5f8;
  Error local_5d8;
  Value local_5b0;
  Status local_561;
  uint64_t uStack_560;
  RegistryStatus status;
  uint64_t nid;
  BorderRouter br;
  undefined1 local_3c0 [8];
  Expression expr;
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_360 [16];
  v10 *local_350;
  ulong local_348;
  v10 *local_340;
  size_t sStack_338;
  string *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_328 [3];
  undefined1 local_310 [16];
  v10 *local_300;
  ulong local_2f8;
  v10 *local_2f0;
  size_t sStack_2e8;
  string *local_2e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_2d8 [3];
  undefined1 local_2c0 [16];
  v10 *local_2b0;
  ulong local_2a8;
  v10 *local_2a0;
  size_t sStack_298;
  string *local_290;
  v10 *local_288;
  v10 **local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_278 [2];
  undefined1 local_268 [16];
  v10 *local_258;
  char *local_250;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_248;
  v10 *local_240;
  char *pcStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_228 [3];
  undefined1 local_210 [16];
  v10 *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  v10 *local_1e8;
  char *pcStack_1e0;
  string *local_1d8;
  v10 *local_1d0;
  v10 **local_1c8;
  v10 *local_1c0;
  v10 **local_1b8;
  v10 *local_1b0;
  v10 **local_1a8;
  v10 *local_1a0;
  v10 **local_198;
  v10 **local_190;
  v10 *local_188;
  size_t sStack_180;
  v10 **local_170;
  v10 *local_168;
  size_t sStack_160;
  v10 **local_150;
  v10 *local_148;
  size_t sStack_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  undefined1 *local_118;
  Value **local_110;
  undefined1 *local_108;
  Value **local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f0;
  Value **local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_10;
  
  bVar1 = false;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3c0,aExpr);
  persistent_storage::BorderRouter::BorderRouter((BorderRouter *)&nid);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(aExpr);
  if (sVar4 == 1) {
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mRegistry);
    local_561 = persistent_storage::Registry::GetCurrentNetworkXpan(peVar5,&stack0xfffffffffffffaa0)
    ;
    if (local_561 == kSuccess) {
      peVar6 = std::
               __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mJobManager);
      JobManager::GetSelectedCommissioner
                (&local_680,peVar6,
                 (CommissionerAppPtr *)
                 &expr.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Value::Value(&local_658,&local_680);
      pVVar7 = Value::operator=(__return_storage_ptr__,&local_658);
      local_684 = kNone;
      bVar1 = Value::operator!=(pVVar7,&local_684);
      Value::~Value(&local_658);
      Error::~Error(&local_680);
      if (!bVar1) {
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mJobManager);
        JobManager::MakeBorderRouterChoice(&local_6f8,peVar6,uStack_560,(BorderRouter *)&nid);
        Value::Value(&local_6d0,&local_6f8);
        pVVar7 = Value::operator=(__return_storage_ptr__,&local_6d0);
        local_6fc = kNone;
        bVar1 = Value::operator!=(pVVar7,&local_6fc);
        Value::~Value(&local_6d0);
        Error::~Error(&local_6f8);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3c0,(value_type *)&br.mAgent);
          std::__cxx11::to_string((string *)local_720,(uint)(ushort)br.mAgent.mAddr.field_2._8_2_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3c0,(value_type *)local_720);
          std::__cxx11::string::~string((string *)local_720);
          goto LAB_0023bfb5;
        }
      }
    }
    else {
      ProcessStart::anon_class_1_0_00000001::operator()(&local_60a);
      local_280 = &local_608;
      local_288 = &local_609;
      bVar8 = ::fmt::v10::operator()(local_288);
      local_600 = bVar8.size_;
      local_608 = (v10 *)bVar8.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_290 = &local_5f8;
      local_2a0 = local_608;
      sStack_298 = local_600;
      local_190 = &local_2a0;
      local_2b0 = local_608;
      local_2a8 = local_600;
      local_188 = local_2b0;
      sStack_180 = local_2a8;
      local_2d8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_128 = local_2c0;
      local_130 = local_2d8;
      local_b0 = 0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_2a8;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_130;
      local_f0 = local_130;
      local_b8 = local_130;
      local_a8 = local_128;
      ::fmt::v10::vformat_abi_cxx11_(&local_5f8,local_2b0,fmt,args);
      Error::Error(&local_5d8,kRegistryError,&local_5f8);
      Value::Value(&local_5b0,&local_5d8);
      Value::operator=(__return_storage_ptr__,&local_5b0);
      Value::~Value(&local_5b0);
      Error::~Error(&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
    }
  }
  else if (sVar4 == 2) {
    persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)&guard.field_0x14);
    NetworkSelectionComparator::NetworkSelectionComparator
              ((NetworkSelectionComparator *)local_740,this);
    aStr = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3c0,1);
    utils::ParseInteger<unsigned_int>(&local_7b0,(uint *)&guard.field_0x14,aStr);
    Value::Value(&local_788,&local_7b0);
    pVVar7 = Value::operator=(__return_storage_ptr__,&local_788);
    local_7b4 = kNone;
    bVar3 = Value::operator!=(pVVar7,&local_7b4);
    Value::~Value(&local_788);
    Error::~Error(&local_7b0);
    if (bVar3) {
      guard_1._20_4_ = 5;
    }
    else {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mRegistry);
      local_7b8 = guard._20_4_;
      this_00 = (v10 *)(ulong)(uint)guard._20_4_;
      SVar2 = persistent_storage::Registry::GetBorderRouter
                        (peVar5,(BorderRouterId)guard._20_4_,(BorderRouter *)&nid);
      if (SVar2 == kSuccess) {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mRegistry);
        SVar2 = persistent_storage::Registry::SetCurrentNetwork(peVar5,(BorderRouter *)&nid);
        if (SVar2 == kSuccess) {
          UpdateNetworkSelectionInfo(&local_930,this,false);
          local_934 = kNone;
          bVar3 = commissioner::operator!=(&local_930,&local_934);
          Error::~Error(&local_930);
          if (bVar3) {
            guard_1._20_4_ = 5;
          }
          else {
            peVar6 = std::
                     __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->mJobManager);
            JobManager::GetSelectedCommissioner
                      (&local_9a8,peVar6,
                       (CommissionerAppPtr *)
                       &expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Value::Value(&local_980,&local_9a8);
            pVVar7 = Value::operator=(__return_storage_ptr__,&local_980);
            local_9ac = kNone;
            bVar3 = Value::operator!=(pVVar7,&local_9ac);
            Value::~Value(&local_980);
            Error::~Error(&local_9a8);
            if (bVar3) {
              guard_1._20_4_ = 5;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3c0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3c0,(value_type *)&br.mAgent);
              std::__cxx11::to_string(&local_9d0,(uint)(ushort)br.mAgent.mAddr.field_2._8_2_);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_3c0,&local_9d0);
              std::__cxx11::string::~string((string *)&local_9d0);
              guard_1._20_4_ = 2;
            }
          }
        }
        else {
          ProcessStart::anon_class_1_0_00000001::operator()(&local_902);
          local_1b8 = &local_900;
          local_1c0 = &local_901;
          bVar8 = ::fmt::v10::operator()(local_1c0);
          local_8f8 = (char *)bVar8.size_;
          local_900 = (v10 *)bVar8.data_;
          ::fmt::v10::detail::check_format_string<unsigned_int_&,_FMT_COMPILE_STRING,_0>();
          local_248 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                       *)((long)&br._vptr_BorderRouter + 4);
          local_230 = &local_8f0;
          local_240 = local_900;
          pcStack_238 = local_8f8;
          local_80 = &local_240;
          local_258 = local_900;
          local_250 = local_8f8;
          local_78 = local_258;
          pcStack_70 = local_250;
          local_278[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                   (local_248,(v10 *)local_230,(uint *)local_900);
          local_30 = local_268;
          local_38 = local_278;
          local_20 = 2;
          fmt_01.size_ = 2;
          fmt_01.data_ = local_250;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_38;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          ::fmt::v10::vformat_abi_cxx11_(&local_8f0,local_258,fmt_01,args_01);
          Error::Error(&local_8d0,kNotFound,&local_8f0);
          Value::Value(&local_8a8,&local_8d0);
          Value::operator=(__return_storage_ptr__,&local_8a8);
          Value::~Value(&local_8a8);
          Error::~Error(&local_8d0);
          std::__cxx11::string::~string((string *)&local_8f0);
          guard_1._20_4_ = 5;
        }
      }
      else {
        ProcessStart::anon_class_1_0_00000001::operator()(&local_85a);
        local_1c8 = &local_858;
        local_1d0 = &local_859;
        bVar8 = ::fmt::v10::operator()(local_1d0);
        local_850 = (char *)bVar8.size_;
        local_858 = (v10 *)bVar8.data_;
        ::fmt::v10::detail::check_format_string<unsigned_int_&,_FMT_COMPILE_STRING,_0>();
        local_1d8 = &local_848;
        local_1e8 = local_858;
        pcStack_1e0 = local_850;
        local_1f0 = &guard.field_0x14;
        local_a0 = &local_1e8;
        local_200 = local_858;
        local_1f8 = local_850;
        local_98 = local_200;
        pcStack_90 = local_1f8;
        local_228[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                   *)local_1f0,this_00,(uint *)local_1d8);
        local_60 = local_210;
        local_68 = local_228;
        local_50 = 2;
        fmt_00.size_ = 2;
        fmt_00.data_ = local_1f8;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_68;
        local_58 = local_68;
        local_48 = local_60;
        local_40 = local_68;
        ::fmt::v10::vformat_abi_cxx11_(&local_848,local_200,fmt_00,args_00);
        Error::Error(&local_828,kNotFound,&local_848);
        Value::Value(&local_800,&local_828);
        Value::operator=(__return_storage_ptr__,&local_800);
        Value::~Value(&local_800);
        Error::~Error(&local_828);
        std::__cxx11::string::~string((string *)&local_848);
        guard_1._20_4_ = 5;
      }
    }
    NetworkSelectionComparator::~NetworkSelectionComparator((NetworkSelectionComparator *)local_740)
    ;
    if (guard_1._20_4_ != 2) goto joined_r0x0023b8b9;
LAB_0023bfb5:
    ProcessStartJob(&local_c30,this,
                    (CommissionerAppPtr *)
                    &expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression *)local_3c0);
    Value::operator=(__return_storage_ptr__,&local_c30);
    Value::~Value(&local_c30);
  }
  else if (sVar4 == 3) {
    NetworkSelectionComparator::NetworkSelectionComparator
              ((NetworkSelectionComparator *)local_9f0,this);
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mRegistry);
    SVar2 = persistent_storage::Registry::ForgetCurrentNetwork(peVar5);
    if (SVar2 == kSuccess) {
      UpdateNetworkSelectionInfo(&local_ac0,this,false);
      local_ac4 = kNone;
      bVar3 = commissioner::operator!=(&local_ac0,&local_ac4);
      Error::~Error(&local_ac0);
      if (bVar3) {
        guard_1._20_4_ = 5;
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mJobManager);
        JobManager::GetSelectedCommissioner
                  (&local_b38,peVar6,
                   (CommissionerAppPtr *)
                   &expr.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Value::Value(&local_b10,&local_b38);
        pVVar7 = Value::operator=(__return_storage_ptr__,&local_b10);
        local_b3c = kNone;
        bVar3 = Value::operator!=(pVVar7,&local_b3c);
        Value::~Value(&local_b10);
        Error::~Error(&local_b38);
        if (bVar3) {
          guard_1._20_4_ = 5;
        }
        else {
          guard_1._20_4_ = 2;
        }
      }
    }
    else {
      ProcessStart::anon_class_1_0_00000001::operator()(&local_a92);
      local_1a8 = &local_a90;
      local_1b0 = &local_a91;
      bVar8 = ::fmt::v10::operator()(local_1b0);
      local_a88 = bVar8.size_;
      local_a90 = (v10 *)bVar8.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_2e0 = &local_a80;
      local_2f0 = local_a90;
      sStack_2e8 = local_a88;
      local_170 = &local_2f0;
      local_300 = local_a90;
      local_2f8 = local_a88;
      local_168 = local_300;
      sStack_160 = local_2f8;
      local_328[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_118 = local_310;
      local_120 = local_328;
      local_c8 = 0;
      fmt_02.size_ = 0;
      fmt_02.data_ = (char *)local_2f8;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_120;
      local_f8 = local_120;
      local_d0 = local_120;
      local_c0 = local_118;
      ::fmt::v10::vformat_abi_cxx11_(&local_a80,local_300,fmt_02,args_02);
      Error::Error(&local_a60,kRegistryError,&local_a80);
      Value::Value(&local_a38,&local_a60);
      Value::operator=(__return_storage_ptr__,&local_a38);
      Value::~Value(&local_a38);
      Error::~Error(&local_a60);
      std::__cxx11::string::~string((string *)&local_a80);
      guard_1._20_4_ = 5;
    }
    NetworkSelectionComparator::~NetworkSelectionComparator((NetworkSelectionComparator *)local_9f0)
    ;
    if (guard_1._20_4_ == 2) goto LAB_0023bfb5;
joined_r0x0023b8b9:
    if (guard_1._20_4_ != 5) goto LAB_0023c008;
  }
  else {
    ProcessStart::anon_class_1_0_00000001::operator()(&local_be2);
    local_198 = &local_be0;
    local_1a0 = &local_be1;
    bVar8 = ::fmt::v10::operator()(local_1a0);
    local_bd8 = bVar8.size_;
    local_be0 = (v10 *)bVar8.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_330 = &local_bd0;
    local_340 = local_be0;
    sStack_338 = local_bd8;
    local_150 = &local_340;
    local_350 = local_be0;
    local_348 = local_bd8;
    local_148 = local_350;
    sStack_140 = local_348;
    value = (Value *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_108 = local_360;
    local_110 = &value;
    local_e0 = 0;
    fmt_03.size_ = 0;
    fmt_03.data_ = (char *)local_348;
    args_03.field_1.values_ = in_R9.values_;
    args_03.desc_ = (unsigned_long_long)local_110;
    local_100 = local_110;
    local_e8 = local_110;
    local_d8 = local_108;
    ::fmt::v10::vformat_abi_cxx11_(&local_bd0,local_350,fmt_03,args_03);
    Error::Error(&local_bb0,kInvalidCommand,&local_bd0);
    Value::Value(&local_b88,&local_bb0);
    Value::operator=(__return_storage_ptr__,&local_b88);
    Value::~Value(&local_b88);
    Error::~Error(&local_bb0);
    std::__cxx11::string::~string((string *)&local_bd0);
  }
  bVar1 = true;
  guard_1._20_4_ = 1;
LAB_0023c008:
  persistent_storage::BorderRouter::~BorderRouter((BorderRouter *)&nid);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c0);
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStart(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    Expression         expr         = aExpr;
    BorderRouter       br;

    switch (aExpr.size())
    {
    case 1:
    {
        // starting currently selected network
        uint64_t       nid;
        RegistryStatus status = mRegistry->GetCurrentNetworkXpan(nid);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("getting selected network failed"));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = mJobManager->MakeBorderRouterChoice(nid, br));
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 2:
    {
        // starting newtork by br raw id (experimental, for dev tests only)
        persistent_storage::BorderRouterId rawid;
        NetworkSelectionComparator         guard(*this);

        SuccessOrExit(value = ParseInteger(rawid.mId, expr[1]));
        VerifyOrExit(mRegistry->GetBorderRouter(rawid, br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("br[{}] not found", rawid.mId));
        VerifyOrExit(mRegistry->SetCurrentNetwork(br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("network selection failed for nwk[{}]", br.mNetworkId.mId));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        expr.pop_back();
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 3:
    {
        NetworkSelectionComparator guard(*this);

        // starting network with explicit br_addr and br_port
        VerifyOrExit(mRegistry->ForgetCurrentNetwork() == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("failed to drop network selection"));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        break;
    }
    default:
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_MANY_ARGS));
    }

    value = ProcessStartJob(commissioner, expr);
exit:
    return value;
}